

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O0

LPVOID HeapAlloc(HANDLE hHeap,DWORD dwFlags,SIZE_T numberOfBytes)

{
  BYTE *pMem;
  SIZE_T numberOfBytes_local;
  DWORD dwFlags_local;
  HANDLE hHeap_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (hHeap == (HANDLE)0x1020304) {
    if ((dwFlags == 0) || (dwFlags == 8)) {
      hHeap_local = PAL_malloc(numberOfBytes);
      if (hHeap_local == (void *)0x0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        SetLastError(8);
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        hHeap_local = (HANDLE)0x0;
      }
      else {
        if (dwFlags == 8) {
          memset(hHeap_local,0,numberOfBytes);
        }
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","HeapAlloc",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/memory/heap.cpp"
              ,0xf0);
      fprintf(_stderr,"Invalid parameter dwFlags=%#x\n",(ulong)dwFlags);
      SetLastError(0x57);
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      hHeap_local = (HANDLE)0x0;
    }
  }
  else {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    SetLastError(0x57);
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    hHeap_local = (HANDLE)0x0;
  }
  return hHeap_local;
}

Assistant:

LPVOID
PALAPI
HeapAlloc(
    IN HANDLE hHeap,
    IN DWORD dwFlags,
    IN SIZE_T numberOfBytes)
{
    BYTE *pMem;

    PERF_ENTRY(HeapAlloc);
    ENTRY("HeapAlloc (hHeap=%p, dwFlags=%#x, numberOfBytes=%u)\n",
          hHeap, dwFlags, numberOfBytes);

#ifdef __APPLE__
    if (hHeap == NULL)
#else // __APPLE__
    if (hHeap != (HANDLE) DUMMY_HEAP)
#endif // __APPLE__ else
    {
        ERROR("Invalid heap handle\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        LOGEXIT("HeapAlloc returning NULL\n");
        PERF_EXIT(HeapAlloc);
        return NULL;
    }

    if ((dwFlags != 0) && (dwFlags != HEAP_ZERO_MEMORY))
    {
        ASSERT("Invalid parameter dwFlags=%#x\n", dwFlags);
        SetLastError(ERROR_INVALID_PARAMETER);
        LOGEXIT("HeapAlloc returning NULL\n");
        PERF_EXIT(HeapAlloc);
        return NULL;
    }

#ifdef __APPLE__
    // This is patterned off of InternalMalloc in malloc.cpp.
    {
        pMem = (BYTE *)malloc_zone_malloc((malloc_zone_t *)hHeap, numberOfBytes);
    }
#else // __APPLE__
    pMem = (BYTE *) PAL_malloc(numberOfBytes);
#endif // __APPLE__ else

    if (pMem == NULL)
    {
        ERROR("Not enough memory\n");
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        LOGEXIT("HeapAlloc returning NULL\n");
        PERF_EXIT(HeapAlloc);
        return NULL;
    }

    /* If the HEAP_ZERO_MEMORY flag is set initialize to zero */
    if (dwFlags == HEAP_ZERO_MEMORY)
    {
        memset(pMem, 0, numberOfBytes);
    }

    LOGEXIT("HeapAlloc returning LPVOID %p\n", pMem);
    PERF_EXIT(HeapAlloc);
    return (pMem);
}